

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O1

void __thiscall
JetHead::list<Timer::TimerNode>::push_back(list<Timer::TimerNode> *this,TimerNode *val)

{
  Node *pNVar1;
  TimerListener *pTVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Node *this_00;
  
  this_00 = (Node *)operator_new(0x38,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                 ,0xa7);
  (this_00->val).mEvent.mObj = (Event *)0x0;
  SmartPtr<Event>::operator=((SmartPtr<Event> *)this_00,(val->mEvent).mObj);
  pTVar2 = val->mListener;
  uVar3 = val->mPrivateData;
  uVar4 = val->mTick;
  uVar5 = val->mRepeatMS;
  uVar6 = val->mRemainingMS;
  (this_00->val).mDispatcher = val->mDispatcher;
  (this_00->val).mListener = pTVar2;
  (this_00->val).mPrivateData = uVar3;
  (this_00->val).mTick = uVar4;
  (this_00->val).mRepeatMS = uVar5;
  (this_00->val).mRemainingMS = uVar6;
  pNVar1 = this->mTail;
  this_00->prev = pNVar1->prev;
  this_00->next = pNVar1;
  pNVar1->prev->next = this_00;
  pNVar1->prev = this_00;
  return;
}

Assistant:

void push_back(const T& val)
		{
			Node* newTail = jh_new Node;
			newTail->val = val;
			newTail->prev = mTail->prev;
			newTail->next = mTail;

			mTail->prev->next = newTail;
			mTail->prev = newTail;
		}